

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O2

void __thiscall
WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_>::~WienerDenoiseTest
          (WienerDenoiseTest<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  long lVar1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__WienerDenoiseTest_00eff920;
  lVar1 = 0xd0;
  do {
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)((long)this->data_ + lVar1 + -0x10));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x88);
  lVar1 = 0x88;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)this->data_ + lVar1 + -0x10));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)this->data_ + lVar1 + -0x10));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -8);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

static void SetUpTestSuite() { aom_dsp_rtcd(); }